

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O3

void njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering::TabulatedDistribution::verifySize
               (int NW,int NL)

{
  undefined8 *puVar1;
  
  if (NL * 2 == NW) {
    return;
  }
  tools::Log::error<char_const*>("Encountered illegal NW and NL values");
  tools::Log::info<char_const*>("NW must be equal to 2 * NL for tabulated cosines");
  tools::Log::info<char_const*,int>("NW value: {}",NW);
  tools::Log::info<char_const*,int>("NL value: {}",NL);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NW, int NL ) {

  if ( NW != 2 * NL ) {

    Log::error( "Encountered illegal NW and NL values" );
    Log::info( "NW must be equal to 2 * NL for tabulated cosines" );
    Log::info( "NW value: {}", NW );
    Log::info( "NL value: {}", NL );
    throw std::exception();
  }
}